

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sem_wait.c
# Opt level: O1

int nsync_sem_wait_with_cancel_(waiter *w,nsync_time abs_deadline,nsync_note cancel_note)

{
  nsync_mu *mu;
  __syscall_slong_t _Var1;
  int iVar2;
  int iVar3;
  nsync_dll_list_ pnVar4;
  nsync_time *pnVar5;
  __time_t _Var6;
  nsync_time abs_deadline_00;
  nsync_time nVar7;
  nsync_time a;
  nsync_time b;
  nsync_waiter_s nw;
  undefined4 local_68 [2];
  nsync_dll_element_ local_60;
  undefined4 local_48;
  nsync_semaphore *local_40;
  undefined4 local_38;
  
  if (cancel_note == (nsync_note)0x0) {
    iVar2 = nsync_mu_semaphore_p_with_deadline(&w->sem,abs_deadline);
    return iVar2;
  }
  nVar7 = nsync_note_notified_deadline_(cancel_note);
  pnVar5 = &nsync_time_zero;
  iVar2 = nsync_time_cmp(nVar7,(nsync_time)ZEXT816((ulong)0));
  if (0 < iVar2) {
    local_68[0] = 0x726d2ba9;
    local_40 = &w->sem;
    nsync_dll_init_(&local_60,local_68);
    local_48 = 1;
    local_38 = 0;
    mu = &cancel_note->note_mu;
    nsync_mu_lock(mu);
    if (cancel_note->notified == 0) {
      if (cancel_note->expiry_time_valid == 0) {
        pnVar5 = &nsync_time_no_deadline;
      }
      else {
        pnVar5 = &cancel_note->expiry_time;
      }
    }
    _Var1 = pnVar5->tv_nsec;
    _Var6 = pnVar5->tv_sec;
    nVar7.tv_nsec = _Var1;
    nVar7.tv_sec = _Var6;
    iVar2 = nsync_time_cmp(nVar7,(nsync_time)ZEXT816((ulong)0));
    if (iVar2 < 1) {
      iVar2 = 0x7d;
    }
    else {
      pnVar4 = nsync_dll_make_last_in_list_(cancel_note->waiters,&local_60);
      cancel_note->waiters = pnVar4;
      b.tv_nsec = _Var1;
      b.tv_sec = _Var6;
      iVar3 = nsync_time_cmp(abs_deadline,b);
      if (iVar3 < 0) {
        _Var6 = abs_deadline.tv_sec;
        _Var1 = abs_deadline.tv_nsec;
      }
      nsync_mu_unlock(mu);
      abs_deadline_00.tv_nsec = _Var1;
      abs_deadline_00.tv_sec = _Var6;
      iVar2 = nsync_mu_semaphore_p_with_deadline(&w->sem,abs_deadline_00);
      if (iVar2 == 0x6e && iVar3 >= 0) {
        nsync_note_notify(cancel_note);
        iVar2 = 0x7d;
      }
      nsync_mu_lock(mu);
      if (cancel_note->notified == 0) {
        if (cancel_note->expiry_time_valid == 0) {
          pnVar5 = &nsync_time_no_deadline;
        }
        else {
          pnVar5 = &cancel_note->expiry_time;
        }
      }
      else {
        pnVar5 = &nsync_time_zero;
      }
      a.tv_nsec = pnVar5->tv_nsec;
      a.tv_sec = pnVar5->tv_sec;
      iVar3 = nsync_time_cmp(a,(nsync_time)ZEXT816((ulong)0));
      if (0 < iVar3) {
        pnVar4 = nsync_dll_remove_(cancel_note->waiters,&local_60);
        cancel_note->waiters = pnVar4;
      }
    }
    nsync_mu_unlock(mu);
    return iVar2;
  }
  return 0x7d;
}

Assistant:

NSYNC_CPP_START_

/* Wait until one of:
     w->sem is non-zero----decrement it and return 0.
     abs_deadline expires---return ETIMEDOUT.
     cancel_note is non-NULL and *cancel_note becomes notified---return ECANCELED. */
int nsync_sem_wait_with_cancel_ (waiter *w, nsync_time abs_deadline,
			         nsync_note cancel_note) {
	int sem_outcome;
	if (cancel_note == NULL) {
		sem_outcome = nsync_mu_semaphore_p_with_deadline (&w->sem, abs_deadline);
	} else {
		nsync_time cancel_time;
		cancel_time = nsync_note_notified_deadline_ (cancel_note);
		sem_outcome = ECANCELED;
		if (nsync_time_cmp (cancel_time, nsync_time_zero) > 0) {
			struct nsync_waiter_s nw;
			nw.tag = NSYNC_WAITER_TAG;
			nw.sem = &w->sem;
			nsync_dll_init_ (&nw.q, &nw);
			ATM_STORE (&nw.waiting, 1);
			nw.flags = 0;
			nsync_mu_lock (&cancel_note->note_mu);
			cancel_time = NOTIFIED_TIME (cancel_note);
			if (nsync_time_cmp (cancel_time, nsync_time_zero) > 0) {
				nsync_time local_abs_deadline;
				int deadline_is_nearer = 0;
				cancel_note->waiters = nsync_dll_make_last_in_list_ (
					cancel_note->waiters, &nw.q);
				local_abs_deadline = cancel_time;
				if (nsync_time_cmp (abs_deadline, cancel_time) < 0) {
					local_abs_deadline = abs_deadline;
					deadline_is_nearer = 1;
				}
				nsync_mu_unlock (&cancel_note->note_mu);
				sem_outcome = nsync_mu_semaphore_p_with_deadline (&w->sem,
					local_abs_deadline);
				if (sem_outcome == ETIMEDOUT && !deadline_is_nearer) {
					sem_outcome = ECANCELED;
					nsync_note_notify (cancel_note);
				}
				nsync_mu_lock (&cancel_note->note_mu);
				cancel_time = NOTIFIED_TIME (cancel_note);
				if (nsync_time_cmp (cancel_time,
						    nsync_time_zero) > 0) {
					cancel_note->waiters = nsync_dll_remove_ (
						cancel_note->waiters, &nw.q);
				}
			}
			nsync_mu_unlock (&cancel_note->note_mu);
		}
	}
	return (sem_outcome);
}